

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O3

FieldBase * __thiscall FIX::FieldMap::reverse_find(FieldMap *this,int tag)

{
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  __tmp;
  FieldNotFound *this_00;
  const_reverse_iterator field;
  string local_58;
  pointer local_38;
  pointer local_30;
  
  local_30 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_58._M_dataplus._M_p =
       (pointer)(this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>,__gnu_cxx::__ops::_Iter_pred<FIX::FieldMap::finder>>
            (&local_38,&local_58,&local_30,tag);
  if (local_38 !=
      (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
      super__Vector_impl_data._M_start) {
    return local_38 + -1;
  }
  this_00 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  FieldNotFound::FieldNotFound(this_00,tag,&local_58);
  __cxa_throw(this_00,&FieldNotFound::typeinfo,FIX::Exception::~Exception);
}

Assistant:

const FieldBase &reverse_find(int tag) const {
    Fields::const_reverse_iterator field = std::find_if(m_fields.rbegin(), m_fields.rend(), finder(tag));
    if (field == m_fields.rend()) {
      throw FieldNotFound(tag);
    }

    return *field;
  }